

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GLES2ProgramSharingTest::renderResource
          (GLES2ProgramSharingTest *this,Surface *screen,Surface *reference)

{
  glReadPixelsFunc p_Var1;
  uint uVar2;
  GLenum GVar3;
  GLuint GVar4;
  GLuint GVar5;
  TestError *this_00;
  GLsizei GVar6;
  GLsizei GVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  void *pvVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  float fVar15;
  int iVar16;
  int iVar17;
  float t;
  float fVar18;
  float fVar19;
  float fVar20;
  uint uVar21;
  float fVar22;
  uint uVar23;
  float fVar24;
  uint uVar25;
  uint uVar26;
  float fVar27;
  uint uVar28;
  uint uVar29;
  IVec4 local_68;
  PixelBufferAccess local_58;
  
  if (screen == (Surface *)0x0) {
    GVar6 = 0xf0;
    GVar7 = 0xf0;
  }
  else {
    GVar7 = screen->m_width;
    GVar6 = screen->m_height;
  }
  (*(this->super_GLES2SharingTest).m_gl.viewport)(0,0,GVar7,GVar6);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"viewport(0, 0, width, height)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x2c8);
  (*(this->super_GLES2SharingTest).m_gl.clearColor)(1.0,0.0,0.0,1.0);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"clearColor(1.0f, 0.0f, 0.0f, 1.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x2ca);
  (*(this->super_GLES2SharingTest).m_gl.clear)(0x4000);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"clear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x2cb);
  (*(this->super_GLES2SharingTest).m_gl.useProgram)((this->m_program->m_program).m_program);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"useProgram(m_program->getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x2cd);
  GVar4 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)
                    ((this->m_program->m_program).m_program,"a_pos");
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x2d0);
  if (GVar4 == 0xffffffff) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"coordLocation != (GLuint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x2d1);
  }
  else {
    GVar5 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)
                      ((this->m_program->m_program).m_program,"a_color");
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"glGetAttribLocation()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x2d4);
    if (GVar5 != 0xffffffff) {
      (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar5);
      GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar3,"enableVertexAttribArray(colorLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2d7);
      (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar4);
      GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar3,"enableVertexAttribArray(coordLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2d8);
      (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                (GVar5,4,0x1406,'\0',0,renderResource::colors);
      GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar3,"vertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, colors)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2da);
      (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                (GVar4,2,0x1406,'\0',0,renderResource::coords);
      GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar3,"vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2db);
      (*(this->super_GLES2SharingTest).m_gl.drawElements)(4,6,0x1403,renderResource::indices);
      GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar3,"drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2dd);
      (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar4);
      GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar3,"disableVertexAttribArray(coordLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2de);
      (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar5);
      GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar3,"disableVertexAttribArray(colorLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2df);
      (*(this->super_GLES2SharingTest).m_gl.useProgram)(0);
      GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar3,"useProgram(0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2e0);
      if (screen != (Surface *)0x0) {
        p_Var1 = (this->super_GLES2SharingTest).m_gl.readPixels;
        iVar16 = screen->m_width;
        iVar17 = screen->m_height;
        local_68.m_data[0] = RGBA;
        local_68.m_data[1] = UNORM_INT8;
        pvVar11 = (void *)(screen->m_pixels).m_cap;
        if (pvVar11 != (void *)0x0) {
          pvVar11 = (screen->m_pixels).m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  (&local_58,(TextureFormat *)&local_68,iVar16,iVar17,1,pvVar11);
        (*p_Var1)(0,0,iVar16,iVar17,0x1908,0x1401,local_58.super_ConstPixelBufferAccess.m_data);
        local_68.m_data[0] = RGBA;
        local_68.m_data[1] = UNORM_INT8;
        pvVar11 = (void *)(reference->m_pixels).m_cap;
        if (pvVar11 != (void *)0x0) {
          pvVar11 = (reference->m_pixels).m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  (&local_58,(TextureFormat *)&local_68,reference->m_width,reference->m_height,1,
                   pvVar11);
        local_68.m_data[0] = 0xff;
        local_68.m_data[1] = SNORM_INT8;
        local_68.m_data[2] = 0;
        local_68.m_data[3] = 0xff;
        tcu::clear(&local_58,&local_68);
        fVar15 = (float)GVar7 * 0.5;
        iVar16 = (int)(fVar15 * -0.9 + fVar15);
        iVar17 = (int)(fVar15 * 0.9 + fVar15);
        if (iVar16 <= iVar17) {
          fVar15 = (float)GVar6 * 0.5;
          iVar8 = (int)(fVar15 * -0.9 + fVar15);
          iVar9 = (int)(fVar15 * 0.9 + fVar15);
          iVar10 = iVar16;
          do {
            if (iVar8 <= iVar9) {
              fVar15 = (float)(iVar10 - iVar16) / (float)(iVar17 - iVar16);
              fVar18 = 1.0 - fVar15;
              pvVar11 = (reference->m_pixels).m_ptr;
              iVar12 = 0;
              do {
                fVar19 = (float)iVar12 / (float)(iVar9 - iVar8);
                if (fVar15 <= fVar19) {
                  fVar27 = 1.0 - fVar19;
                  fVar19 = fVar19 - fVar15;
                  fVar20 = fVar19 * 0.0 + fVar27 * 0.0 + fVar15 * 0.0;
                  fVar22 = fVar19 * 0.0 + fVar27 * 0.0 + fVar15 * 1.0;
                  fVar24 = fVar19 * 1.0 + fVar27 * 0.0 + fVar15 * 0.0;
                  fVar19 = fVar19 * 1.0 + fVar27 * 1.0 + fVar15 * 1.0;
                }
                else {
                  fVar27 = fVar15 - fVar19;
                  fVar20 = fVar19 * 0.0 + fVar27 * 1.0 + fVar18 * 0.0;
                  fVar22 = fVar19 * 1.0 + fVar27 * 0.0 + fVar18 * 0.0;
                  fVar24 = fVar19 * 0.0 + fVar27 * 0.0 + fVar18 * 0.0;
                  fVar19 = fVar19 * 1.0 + fVar27 * 1.0 + fVar18 * 1.0;
                }
                uVar21 = (uint)(fVar20 * 255.0);
                uVar23 = (uint)(fVar22 * 255.0);
                uVar25 = (uint)(fVar24 * 255.0);
                uVar26 = (uint)(fVar19 * 255.0);
                uVar2 = uVar21;
                if (0xfe < uVar21) {
                  uVar2 = 0xff;
                }
                uVar14 = uVar23;
                if (0xfe < uVar23) {
                  uVar14 = 0xff;
                }
                uVar28 = -(uint)(-0x7fffff02 < (int)(uVar25 ^ 0x80000000));
                uVar29 = -(uint)(-0x7fffff02 < (int)(uVar26 ^ 0x80000000));
                *(uint *)((long)pvVar11 + (long)((iVar8 + iVar12) * reference->m_width + iVar10) * 4
                         ) = ~((int)uVar26 >> 0x1f) & (uVar29 >> 0x18 | ~uVar29 & uVar26) << 0x18 |
                             ~((int)uVar23 >> 0x1f) & uVar14 << 8 |
                             ~((int)uVar25 >> 0x1f) & (uVar28 >> 0x18 | ~uVar28 & uVar25) << 0x10 |
                             ~((int)uVar21 >> 0x1f) & uVar2;
                iVar13 = iVar8 + iVar12;
                iVar12 = iVar12 + 1;
              } while (iVar13 + 1 <= iVar9);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 <= iVar17);
        }
      }
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"colorLocation != (GLuint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x2d5);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GLES2ProgramSharingTest::renderResource (tcu::Surface* screen, tcu::Surface* reference)
{
	DE_ASSERT((screen && reference) || (!screen && !reference));

	int width = 240;
	int height = 240;

	if (screen)
	{
		width = screen->getWidth();
		height = screen->getHeight();
	}

	static const GLfloat coords[] = {
		-0.9f, -0.9f,
		 0.9f, -0.9f,
		 0.9f,  0.9f,
		-0.9f,  0.9f
	};

	static const GLfloat colors [] = {
		0.0f, 0.0f, 0.0f, 1.0f,
		1.0f, 0.0f, 0.0f, 1.0f,
		0.0f, 1.0f, 0.0f, 1.0f,
		0.0f, 0.0f, 1.0f, 1.0f
	};

	static const GLushort indices[] = {
		0, 1, 2,
		2, 3, 0
	};

	GLU_CHECK_GLW_CALL(m_gl, viewport(0, 0, width, height));

	GLU_CHECK_GLW_CALL(m_gl, clearColor(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_GLW_CALL(m_gl, clear(GL_COLOR_BUFFER_BIT));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(m_program->getProgram()));

	GLuint coordLocation = m_gl.getAttribLocation(m_program->getProgram(), "a_pos");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(coordLocation != (GLuint)-1);

	GLuint colorLocation = m_gl.getAttribLocation(m_program->getProgram(), "a_color");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(colorLocation != (GLuint)-1);

	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(coordLocation));

	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, colors));
	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords));

	GLU_CHECK_GLW_CALL(m_gl, drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(coordLocation));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, useProgram(0));

	if (screen)
	{
		m_gl.readPixels(0, 0, screen->getWidth(), screen->getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen->getAccess().getDataPtr());

		tcu::clear(reference->getAccess(), tcu::IVec4(0xff, 0, 0, 0xff));

		int x1 = (int)(((float)width/2.0f)  * (-0.9f) + ((float)width/2.0f));
		int x2 = (int)(((float)width/2.0f)  *   0.9f  + ((float)width/2.0f));
		int y1 = (int)(((float)height/2.0f) * (-0.9f) + ((float)height/2.0f));
		int y2 = (int)(((float)height/2.0f) *   0.9f  + ((float)height/2.0f));

		for (int x = x1; x <= x2; x++)
		{
			for (int y = y1; y <= y2; y++)
			{
				float t = ((float)(x-x1) / (float)(x2-x1));
				float s = ((float)(y-y1) / (float)(y2-y1));
				bool isUpper = t > s;

				tcu::Vec4 a(colors[0],		colors[1],		colors[2],		colors[3]);
				tcu::Vec4 b(colors[4 + 0],	colors[4 + 1],	colors[4 + 2],	colors[4 + 3]);
				tcu::Vec4 c(colors[8 + 0],	colors[8 + 1],	colors[8 + 2],	colors[8 + 3]);
				tcu::Vec4 d(colors[12 + 0],	colors[12 + 1],	colors[12 + 2],	colors[12 + 3]);


				tcu::Vec4 color;

				if (isUpper)
					color = a * (1.0f - t)  + b * (t - s) + s * c;
				else
					color = a * (1.0f - s)  + d * (s - t) + t * c;

				int red		= deClamp32((int)(255.0f * color.x()), 0, 255);
				int green	= deClamp32((int)(255.0f * color.y()), 0, 255);
				int blue	= deClamp32((int)(255.0f * color.z()), 0, 255);
				int alpha	= deClamp32((int)(255.0f * color.w()), 0, 255);

				reference->setPixel(x, y, tcu::RGBA(red, green, blue, alpha));
			}
		}
	}
}